

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::MiniTableExtensionVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  string local_30;
  
  (anonymous_namespace)::ToCIdent_abi_cxx11_(&local_30,(_anonymous_namespace_ *)this,full_name);
  std::operator+(__return_storage_ptr__,&local_30,"_ext");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableExtensionVarName(absl::string_view full_name) {
  return ToCIdent(full_name) + "_ext";
}